

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

_Bool roaring64_bitmap_intersect(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  undefined1 uVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  art_iterator_t *key;
  art_iterator_t *iterator;
  art_iterator_t it2;
  art_iterator_t it1;
  art_iterator_t local_130;
  art_iterator_t local_a8;
  
  art_init_iterator(&local_a8,&r1->art,true);
  art_init_iterator(&local_130,&r2->art,true);
  if ((local_a8.value != (art_val_t *)0x0) && (local_130.value != (art_val_t *)0x0)) {
    do {
      iVar2 = art_compare_keys(local_a8.key,local_130.key);
      if (iVar2 == 0) {
        bVar3 = local_a8.value[1].key[0];
        if (bVar3 == 4) {
          bVar3 = *(byte *)(*(long *)(local_a8.value[1].key + 2) + 8);
        }
        bVar4 = local_130.value[1].key[0];
        if (bVar4 == 4) {
          bVar4 = *(byte *)(*(long *)(local_130.value[1].key + 2) + 8);
        }
        uVar1 = (*(code *)(&DAT_0012d500 +
                          *(int *)(&DAT_0012d500 + (ulong)(((uint)bVar4 + (uint)bVar3 * 4) - 5) * 4)
                          ))();
        return (_Bool)uVar1;
      }
      key = &local_130;
      iterator = &local_a8;
      if (-1 < iVar2) {
        key = &local_a8;
        iterator = &local_130;
      }
      art_iterator_lower_bound(iterator,key->key);
    } while ((local_a8.value != (art_val_t *)0x0) && (local_130.value != (art_val_t *)0x0));
  }
  return false;
}

Assistant:

bool roaring64_bitmap_intersect(const roaring64_bitmap_t *r1,
                                const roaring64_bitmap_t *r2) {
    bool intersect = false;
    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator(&r2->art, /*first=*/true);

    while (it1.value != NULL && it2.value != NULL) {
        // Cases:
        // 1. it1 <  it2 -> it1++
        // 2. it1 == it1 -> intersect |= it1 & it2, it1++, it2++
        // 3. it1 >  it2 -> it2++
        int compare_result = compare_high48(it1.key, it2.key);
        if (compare_result == 0) {
            // Case 2: iterators at the same high key position.
            leaf_t *leaf1 = (leaf_t *)it1.value;
            leaf_t *leaf2 = (leaf_t *)it2.value;
            intersect |= container_intersect(leaf1->container, leaf1->typecode,
                                             leaf2->container, leaf2->typecode);
            art_iterator_next(&it1);
            art_iterator_next(&it2);
        } else if (compare_result < 0) {
            // Case 1: it1 is before it2.
            art_iterator_lower_bound(&it1, it2.key);
        } else {
            // Case 3: it2 is before it1.
            art_iterator_lower_bound(&it2, it1.key);
        }
    }
    return intersect;
}